

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O3

void replaceFormatNameInFieldList(FMStructDescList l,char *orig,char *repl,int repl_size)

{
  char *__haystack;
  int iVar1;
  FMFieldList *pp_Var2;
  FMFieldList p_Var3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  long lVar9;
  int index;
  int iVar10;
  FMFieldList p_Var11;
  char *old;
  long lVar12;
  
  if (l->format_name != (char *)0x0) {
    lVar9 = 0;
    do {
      p_Var3 = l[lVar9].field_list;
      pcVar8 = p_Var3->field_name;
      if (pcVar8 != (char *)0x0) {
        pp_Var2 = &l[lVar9].field_list;
        lVar12 = 0;
        iVar10 = 0;
        p_Var11 = p_Var3;
        do {
          __haystack = p_Var3->field_type;
          pcVar4 = strstr(__haystack,orig);
          if (pcVar4 != (char *)0x0) {
            if (repl == (char *)0x0) {
              free(pcVar8);
              free((*pp_Var2)[lVar12].field_type);
              p_Var11 = *pp_Var2;
              if (p_Var11[lVar12].field_name != (char *)0x0) {
                p_Var3 = p_Var11 + lVar12;
                do {
                  iVar1 = p_Var3[1].field_offset;
                  p_Var3->field_size = p_Var3[1].field_size;
                  p_Var3->field_offset = iVar1;
                  pcVar8 = p_Var3[1].field_type;
                  p_Var3->field_name = p_Var3[1].field_name;
                  p_Var3->field_type = pcVar8;
                  p_Var11 = *pp_Var2;
                  p_Var3 = p_Var11 + lVar12;
                } while (p_Var3->field_name != (char *)0x0);
              }
              iVar10 = iVar10 + -1;
            }
            else {
              sVar5 = strlen(__haystack);
              sVar6 = strlen(orig);
              sVar7 = strlen(repl);
              pcVar8 = (char *)malloc((sVar5 - sVar6) + sVar7 + 1);
              strncpy(pcVar8,__haystack,(long)pcVar4 - (long)__haystack);
              pcVar8[(long)pcVar4 - (long)__haystack] = '\0';
              strcat(pcVar8,repl);
              strcat(pcVar8,pcVar4 + sVar6);
              free(__haystack);
              p_Var11 = *pp_Var2;
              p_Var11[lVar12].field_type = pcVar8;
              p_Var11[lVar12].field_size = repl_size;
            }
          }
          iVar10 = iVar10 + 1;
          lVar12 = (long)iVar10;
          p_Var3 = p_Var11 + lVar12;
          pcVar8 = p_Var3->field_name;
        } while (pcVar8 != (char *)0x0);
      }
      lVar9 = lVar9 + 1;
    } while (l[lVar9].format_name != (char *)0x0);
  }
  return;
}

Assistant:

static void replaceFormatNameInFieldList(FMStructDescList l, const char *orig, const char *repl,
                                         int repl_size)
{
    int i = 0;
    while (l[i].format_name)
    {
        int j = 0;
        while (l[i].field_list[j].field_name)
        {
            char *loc;
            if ((loc = strstr(l[i].field_list[j].field_type, orig)))
            {
                if (repl)
                {
                    /* replace 'orig' with 'repl' */
                    char *old = (char *)l[i].field_list[j].field_type;
                    char *new = malloc(strlen(old) - strlen(orig) + strlen(repl) + 1);
                    strncpy(new, old, loc - old);
                    new[loc - old] = 0;
                    strcat(new, repl);
                    strcat(new, loc + strlen(orig));
                    free(old);
                    l[i].field_list[j].field_type = new;
                    l[i].field_list[j].field_size = repl_size;
                }
                else
                {
                    /* remove list item with 'orig'  Move higher elements down 1
                     */
                    int index = j;
                    free((char *)l[i].field_list[j].field_name);
                    free((char *)l[i].field_list[j].field_type);
                    while (l[i].field_list[index].field_name != NULL)
                    {
                        l[i].field_list[index] = l[i].field_list[index + 1];
                    }
                    j--; /* we've replaced this element, make sure we process
                            the one we replaced it with */
                }
            }
            j++;
        }
        i++;
    }
}